

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O1

void ecs_os_time_sleep(int32_t sec,int32_t nanosec)

{
  int iVar1;
  timespec sleepTime;
  timespec local_20;
  
  _ecs_assert(-1 < sec,0xc,(char *)0x0,"sec >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/misc.c"
              ,0xd4);
  if (sec < 0) {
    __assert_fail("sec >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/misc.c"
                  ,0xd4,"void ecs_os_time_sleep(int32_t, int32_t)");
  }
  _ecs_assert(-1 < nanosec,0xc,(char *)0x0,"nanosec >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/misc.c"
              ,0xd5);
  if (-1 < nanosec) {
    local_20.tv_sec = (ulong)(uint)sec;
    local_20.tv_nsec = (ulong)(uint)nanosec;
    iVar1 = nanosleep(&local_20,(timespec *)0x0);
    if (iVar1 != 0) {
      ecs_os_err("nanosleep failed");
    }
    return;
  }
  __assert_fail("nanosec >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/misc.c"
                ,0xd5,"void ecs_os_time_sleep(int32_t, int32_t)");
}

Assistant:

void ecs_os_time_sleep(
    int32_t sec, 
    int32_t nanosec) 
{
#ifndef _WIN32
    struct timespec sleepTime;
    ecs_assert(sec >= 0, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(nanosec >= 0, ECS_INTERNAL_ERROR, NULL);

    sleepTime.tv_sec = sec;
    sleepTime.tv_nsec = nanosec;
    if (nanosleep(&sleepTime, NULL)) {
        ecs_os_err("nanosleep failed");
    }
#else
    HANDLE timer;
    LARGE_INTEGER ft;

    ft.QuadPart = -((int64_t)sec * 10000000 + (int64_t)nanosec / 100);

    timer = CreateWaitableTimer(NULL, TRUE, NULL);
    SetWaitableTimer(timer, &ft, 0, NULL, NULL, 0);
    WaitForSingleObject(timer, INFINITE);
    CloseHandle(timer);
#endif
}